

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

AggregateInitialiserList * __thiscall
soul::heart::Parser::parseInitialiserList(Parser *this,FunctionParseState *state,Type *type)

{
  bool bVar1;
  Module *this_00;
  AggregateInitialiserList *pAVar2;
  Expression *pEVar3;
  anon_class_1_0_00000001 getAggregateElementType;
  anon_class_1_0_00000001 local_51;
  FunctionParseState *local_50;
  Expression *local_48 [2];
  RefCountedPtr<soul::Structure> local_38;
  
  local_50 = state;
  this_00 = pool_ptr<soul::Module>::operator->(&this->module);
  pAVar2 = Module::
           allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation&,soul::Type_const&>
                     (this_00,&(this->
                               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                               ).location,type);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x29b537);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x299119);
  if (!bVar1) {
    do {
      parseInitialiserList::anon_class_1_0_00000001::operator()
                ((Type *)local_48,&local_51,type,(uint32_t)(pAVar2->items).numActive);
      pEVar3 = parseExpression(this,local_50,(Type *)local_48);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38);
      local_48[0] = pEVar3;
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
                (&pAVar2->items,(pool_ref<soul::heart::Expression> *)local_48);
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x275d9e);
    } while (bVar1);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x299119);
  }
  return pAVar2;
}

Assistant:

heart::AggregateInitialiserList& parseInitialiserList (const FunctionParseState& state, const Type& type)
    {
        auto& list = module->allocate<heart::AggregateInitialiserList> (location, type);
        expect (HEARTOperator::openParen);

        auto getAggregateElementType = [] (const Type& t, uint32_t index)
        {
            if (t.isFixedSizeAggregate())
            {
                SOUL_ASSERT (index < t.getNumAggregateElements());
                return t.isStruct() ? t.getStructRef().getMemberType (index)
                                    : t.getElementType();
            }

            SOUL_ASSERT (index == 0);
            return t;
        };

        if (! matchIf (HEARTOperator::closeParen))
        {
            for (;;)
            {
                auto& arg = parseExpression (state, getAggregateElementType (type, static_cast<uint32_t> (list.items.size())));
                list.items.push_back (arg);

                if (matchIf (HEARTOperator::comma))
                    continue;

                expect (HEARTOperator::closeParen);
                break;
            }
        }

        return list;
    }